

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CascReadFile.cpp
# Opt level: O1

DWORD CascSetFilePointer(HANDLE hFile,LONG lFilePos,LONG *plFilePosHigh,DWORD dwMoveMethod)

{
  TCascFile *pTVar1;
  long lVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  DWORD dwErrCode;
  
  pTVar1 = IsValidCascFileHandle(hFile);
  if (pTVar1 == (TCascFile *)0x0) {
    dwErrCode = 9;
    goto LAB_00114e4e;
  }
  if (dwMoveMethod == 0) {
LAB_00114e09:
    if (plFilePosHigh == (LONG *)0x0) {
      uVar3 = lFilePos >> 0x1f;
    }
    else {
      uVar3 = *plFilePosHigh;
    }
    uVar5 = (long)lFilePos | (ulong)uVar3 << 0x20;
    uVar4 = 0;
    if (!CARRY8(uVar5,(ulong)dwMoveMethod)) {
      uVar4 = uVar5 + dwMoveMethod;
    }
    if (uVar4 >> 0x20 == 0) {
      pTVar1->FilePointer = (DWORD)uVar4;
      if (plFilePosHigh != (LONG *)0x0) {
        *plFilePosHigh = 0;
      }
      return pTVar1->FilePointer;
    }
  }
  else {
    if (dwMoveMethod == 1) {
      lVar2 = 0x48;
LAB_00114e05:
      dwMoveMethod = *(uint *)((long)&((TCascFile *)(&pTVar1->CKey + -2))->hs + lVar2);
      goto LAB_00114e09;
    }
    if (dwMoveMethod == 2) {
      lVar2 = 0x50;
      goto LAB_00114e05;
    }
  }
  dwErrCode = 0x16;
LAB_00114e4e:
  SetLastError(dwErrCode);
  return 0xffffffff;
}

Assistant:

DWORD WINAPI CascSetFilePointer(HANDLE hFile, LONG lFilePos, LONG * plFilePosHigh, DWORD dwMoveMethod)
{
    TCascFile * hf;
    ULONGLONG FilePosition;
    ULONGLONG MoveOffset;
    DWORD dwFilePosHi;

    // If the hFile is not a valid file handle, return an error.
    hf = IsValidCascFileHandle(hFile);
    if(hf == NULL)
    {
        SetLastError(ERROR_INVALID_HANDLE);
        return CASC_INVALID_POS;
    }

    // Get the relative point where to move from
    switch(dwMoveMethod)
    {
        case FILE_BEGIN:
            FilePosition = 0;
            break;

        case FILE_CURRENT:
            FilePosition = hf->FilePointer;
            break;

        case FILE_END:
            FilePosition = hf->ContentSize;
            break;

        default:
            SetLastError(ERROR_INVALID_PARAMETER);
            return CASC_INVALID_POS;
    }

    // Now get the move offset. Note that both values form
    // a signed 64-bit value (a file pointer can be moved backwards)
    if(plFilePosHigh != NULL)
        dwFilePosHi = *plFilePosHigh;
    else
        dwFilePosHi = (lFilePos & 0x80000000) ? 0xFFFFFFFF : 0;
    MoveOffset = MAKE_OFFSET64(dwFilePosHi, lFilePos);

    // Now calculate the new file pointer
    // Do not allow the file pointer to overflow
    FilePosition = ((FilePosition + MoveOffset) >= FilePosition) ? (FilePosition + MoveOffset) : 0;

    // CASC files can't be bigger than 4 GB.
    // We don't allow to go past 4 GB
    if(FilePosition >> 32)
    {
        SetLastError(ERROR_INVALID_PARAMETER);
        return CASC_INVALID_POS;
    }

    // Change the file position
    hf->FilePointer = (DWORD)FilePosition;

    // Return the new file position
    if(plFilePosHigh != NULL)
        *plFilePosHigh = 0;
    return hf->FilePointer;
}